

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O0

int testNumberOfNeighborsWithInvalidSet(void)

{
  bool bVar1;
  KNearestNeighborsClassifier *this;
  Int64Parameter *this_00;
  Int64Set *pIVar2;
  NearestNeighborsIndex *this_01;
  ostream *poVar3;
  Result local_118;
  Result local_f0;
  Result local_c8;
  undefined4 local_9c;
  undefined1 local_98 [8];
  Result res;
  SingleKdTreeIndex *kdTree;
  NearestNeighborsIndex *nnIndex;
  Int64Parameter *numberOfNeighbors;
  KNearestNeighborsClassifier *knnClassifier;
  undefined1 local_40 [8];
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)local_40);
  CoreML::KNNValidatorTests::generateInterface((Model *)local_40);
  this = CoreML::Specification::Model::mutable_knearestneighborsclassifier((Model *)local_40);
  this_00 = CoreML::Specification::KNearestNeighborsClassifier::mutable_numberofneighbors(this);
  pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
  CoreML::Specification::Int64Set::add_values(pIVar2,0);
  pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
  CoreML::Specification::Int64Set::add_values(pIVar2,4);
  CoreML::Specification::Int64Parameter::set_defaultvalue(this_00,4);
  CoreML::Specification::KNearestNeighborsClassifier::mutable_uniformweighting(this);
  this_01 = CoreML::Specification::KNearestNeighborsClassifier::mutable_nearestneighborsindex(this);
  CoreML::Specification::NearestNeighborsIndex::mutable_squaredeuclideandistance(this_01);
  res.m_message.field_2._8_8_ =
       CoreML::Specification::NearestNeighborsIndex::mutable_singlekdtreeindex(this_01);
  CoreML::Specification::SingleKdTreeIndex::set_leafsize
            ((SingleKdTreeIndex *)res.m_message.field_2._8_8_,0x1e);
  CoreML::Specification::KNearestNeighborsClassifier::set_defaultstringlabel(this,"Default");
  CoreML::validate<(MLModelType)404>((Result *)local_98,(Model *)local_40);
  bVar1 = CoreML::Result::good((Result *)local_98);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x274);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"!((res).good())");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
  }
  else {
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
    CoreML::Specification::Int64Set::clear_values(pIVar2);
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
    CoreML::Specification::Int64Set::add_values(pIVar2,-1);
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
    CoreML::Specification::Int64Set::add_values(pIVar2,4);
    CoreML::Specification::Int64Parameter::set_defaultvalue(this_00,4);
    CoreML::validate<(MLModelType)404>(&local_c8,(Model *)local_40);
    CoreML::Result::operator=((Result *)local_98,&local_c8);
    CoreML::Result::~Result(&local_c8);
    bVar1 = CoreML::Result::good((Result *)local_98);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x27d);
      poVar3 = std::operator<<(poVar3,": error: ");
      poVar3 = std::operator<<(poVar3,"!((res).good())");
      poVar3 = std::operator<<(poVar3," was false, expected true.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      m1._oneof_case_[0] = 1;
    }
    else {
      pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
      CoreML::Specification::Int64Set::clear_values(pIVar2);
      pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
      CoreML::Specification::Int64Set::add_values(pIVar2,-1);
      pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
      CoreML::Specification::Int64Set::add_values(pIVar2,4);
      CoreML::Specification::Int64Parameter::set_defaultvalue(this_00,-1);
      CoreML::validate<(MLModelType)404>(&local_f0,(Model *)local_40);
      CoreML::Result::operator=((Result *)local_98,&local_f0);
      CoreML::Result::~Result(&local_f0);
      bVar1 = CoreML::Result::good((Result *)local_98);
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x286);
        poVar3 = std::operator<<(poVar3,": error: ");
        poVar3 = std::operator<<(poVar3,"!((res).good())");
        poVar3 = std::operator<<(poVar3," was false, expected true.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        m1._oneof_case_[0] = 1;
      }
      else {
        pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
        CoreML::Specification::Int64Set::clear_values(pIVar2);
        pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
        CoreML::Specification::Int64Set::add_values(pIVar2,1);
        pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
        CoreML::Specification::Int64Set::add_values(pIVar2,4);
        CoreML::Specification::Int64Parameter::set_defaultvalue(this_00,4);
        CoreML::validate<(MLModelType)404>(&local_118,(Model *)local_40);
        CoreML::Result::operator=((Result *)local_98,&local_118);
        CoreML::Result::~Result(&local_118);
        bVar1 = CoreML::Result::good((Result *)local_98);
        if (bVar1) {
          m1._oneof_case_[0] = 0;
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                                  );
          poVar3 = std::operator<<(poVar3,":");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x28f);
          poVar3 = std::operator<<(poVar3,": error: ");
          poVar3 = std::operator<<(poVar3,"(res).good()");
          poVar3 = std::operator<<(poVar3," was false, expected true.");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          m1._oneof_case_[0] = 1;
        }
      }
    }
  }
  local_9c = 1;
  CoreML::Result::~Result((Result *)local_98);
  CoreML::Specification::Model::~Model((Model *)local_40);
  return m1._oneof_case_[0];
}

Assistant:

int testNumberOfNeighborsWithInvalidSet() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    auto *numberOfNeighbors = knnClassifier->mutable_numberofneighbors();
    numberOfNeighbors->mutable_set()->add_values(0);
    numberOfNeighbors->mutable_set()->add_values(4);
    numberOfNeighbors->set_defaultvalue(4);

    knnClassifier->mutable_uniformweighting();

    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_squaredeuclideandistance();
    auto *kdTree = nnIndex->mutable_singlekdtreeindex();
    kdTree->set_leafsize(30);
    knnClassifier->set_defaultstringlabel("Default");

    // Validation should fail since defaultValue is not in set
    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_set()->clear_values();
    numberOfNeighbors->mutable_set()->add_values(-1);
    numberOfNeighbors->mutable_set()->add_values(4);
    numberOfNeighbors->set_defaultvalue(4);

    // Validation should fail since set values should be > 0
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_set()->clear_values();
    numberOfNeighbors->mutable_set()->add_values(-1);
    numberOfNeighbors->mutable_set()->add_values(4);
    numberOfNeighbors->set_defaultvalue(-1);

    // Validation should fail since set values should be > 0
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_set()->clear_values();
    numberOfNeighbors->mutable_set()->add_values(1);
    numberOfNeighbors->mutable_set()->add_values(4);
    numberOfNeighbors->set_defaultvalue(4);

    // Validation should now succeed
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_GOOD(res);

    return 0;
}